

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::VerifyAssignmentVisitor::visit(VerifyAssignmentVisitor *this,AssignStmt *stmt)

{
  bool bVar1;
  Var *this_00;
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  int iVar2;
  int iVar3;
  VarType VVar4;
  uint32_t width;
  Var **ppVVar5;
  element_type *peVar6;
  int64_t value;
  bool *pbVar7;
  StmtException *pSVar8;
  remove_reference_t<std::__cxx11::basic_string<char>_> *args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar9;
  string_view format_str;
  string_view format_str_00;
  format_args args_00;
  format_args args_01;
  remove_reference_t<bool_&> *in_stack_fffffffffffffba8;
  allocator<kratos::IRNode_*> *this_01;
  allocator<kratos::IRNode_*> local_371;
  AssignStmt *local_370;
  Var *local_368;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_360;
  Var *local_358;
  Var *local_350;
  AssignStmt **local_348;
  size_type local_340;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_338;
  remove_reference_t<bool_&> local_320 [32];
  char local_300 [32];
  string local_2e0;
  undefined1 local_2ba;
  allocator<kratos::IRNode_*> local_2b9;
  AssignStmt *local_2b8;
  Var *local_2b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2a8;
  Var *local_2a0;
  Var *local_298;
  AssignStmt **local_290;
  size_type local_288;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_280;
  int local_264;
  remove_reference_t<unsigned_int> local_260 [9];
  remove_reference_t<std::__cxx11::basic_string<char>_> local_23c;
  string local_218;
  runtime_error *anon_var_0;
  Const *local_1d0;
  Const *new_const;
  shared_ptr<kratos::Const> old_value;
  Var *right;
  Var *left;
  AssignStmt *stmt_local;
  VerifyAssignmentVisitor *this_local;
  undefined1 local_190 [16];
  char *local_180;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_178;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_130;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  remove_reference_t<unsigned_int> *local_120;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_118;
  __buckets_ptr local_110;
  char *local_108;
  __node_base local_100;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_f8;
  basic_string_view<char> local_e8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *local_90;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *vargs_1;
  remove_reference_t<bool_&> *local_80;
  remove_reference_t<std::__cxx11::basic_string<char>_> *local_78;
  char (*local_70) [64];
  __node_base_ptr local_68;
  string *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  ppVVar5 = AssignStmt::left(stmt);
  this_00 = *ppVVar5;
  ppVVar5 = AssignStmt::right(stmt);
  old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppVVar5;
  iVar2 = (*(this_00->super_IRNode)._vptr_IRNode[7])();
  iVar3 = (*(old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_vptr__Sp_counted_base[7])();
  if ((iVar2 != iVar3) &&
     (VVar4 = Var::type((Var *)old_value.
                               super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi), VVar4 == ConstValue)) {
    Var::as<kratos::Const>((Var *)&new_const);
    peVar6 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&new_const);
    value = Const::value(peVar6);
    width = (*(this_00->super_IRNode)._vptr_IRNode[7])();
    peVar6 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&new_const);
    pbVar7 = Var::is_signed(&peVar6->super_Var);
    local_1d0 = constant(value,width,(bool)(*pbVar7 & 1));
    std::enable_shared_from_this<kratos::Var>::shared_from_this
              ((enable_shared_from_this<kratos::Var> *)&anon_var_0);
    AssignStmt::set_right(stmt,(shared_ptr<kratos::Var> *)&anon_var_0);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&anon_var_0);
    old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0;
    std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)&new_const);
  }
  iVar2 = (*(this_00->super_IRNode)._vptr_IRNode[7])();
  iVar3 = (*(old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_vptr__Sp_counted_base[7])();
  if (iVar2 == iVar3) {
    pbVar7 = Var::is_signed(this_00);
    bVar1 = *pbVar7;
    pbVar7 = Var::is_signed((Var *)old_value.
                                   super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
    if ((bVar1 & 1U) == (*pbVar7 & 1U)) {
      check_expr((Var *)old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,&stmt->super_Stmt);
      return;
    }
    pSVar8 = (StmtException *)__cxa_allocate_exception(0x10);
    (*(this_00->super_IRNode)._vptr_IRNode[0x1f])(local_300);
    args = (remove_reference_t<std::__cxx11::basic_string<char>_> *)Var::is_signed(this_00);
    (*(old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base[0x1f])(local_320);
    aVar9.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         Var::is_signed((Var *)old_value.
                               super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
    local_60 = &local_2e0;
    local_68 = (__node_base_ptr)0x4472cf;
    local_70 = (char (*) [64])local_300;
    local_80 = local_320;
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
               *)aVar9.values_;
    local_78 = args;
    fmt::v7::make_args_checked<std::__cxx11::string,bool&,std::__cxx11::string,bool&,char[64],char>
              (&local_d8,(v7 *)"assignment sign doesn\'t match. left ({0}): {1} right ({2}): {3}",
               local_70,args,local_80,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)aVar9.values_,
               in_stack_fffffffffffffba8);
    local_90 = &local_d8;
    local_e8 = fmt::v7::to_string_view<char,_0>((char *)local_68);
    local_28 = &local_f8;
    local_30 = local_90;
    local_20 = local_90;
    local_18._8_8_ = local_90;
    local_18._M_allocated_capacity = (size_type)local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x7d7d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_90);
    format_str_00.size_ = local_f8.desc_;
    format_str_00.data_ = (char *)local_e8.size_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_f8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_2e0,(detail *)local_e8.data_,format_str_00,args_01);
    local_360 = old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
    local_370 = stmt;
    local_368 = this_00;
    local_358 = Var::width_param(this_00);
    local_350 = Var::width_param((Var *)old_value.
                                        super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
    local_348 = &local_370;
    local_340 = 5;
    this_01 = &local_371;
    std::allocator<kratos::IRNode_*>::allocator(this_01);
    __l._M_len = local_340;
    __l._M_array = (iterator)local_348;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector(&local_338,__l,this_01)
    ;
    StmtException::StmtException(pSVar8,&local_2e0,&local_338);
    __cxa_throw(pSVar8,&StmtException::typeinfo,StmtException::~StmtException);
  }
  local_2ba = 1;
  pSVar8 = (StmtException *)__cxa_allocate_exception(0x10);
  (*(this_00->super_IRNode)._vptr_IRNode[0x1f])(&local_23c.field_0x4);
  local_23c._0_4_ = (*(this_00->super_IRNode)._vptr_IRNode[7])();
  (*(old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[0x1f])(local_260);
  local_264 = (*(old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi)->_vptr__Sp_counted_base[7])();
  local_100._M_nxt = (_Hash_node_base *)&local_218;
  local_108 = "assignment width doesn\'t match. left ({0}): {1} right ({2}): {3}";
  local_110 = (__buckets_ptr)&local_23c.field_0x4;
  local_118 = &local_23c;
  local_120 = local_260;
  aVar9.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_264;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
           *)aVar9.values_;
  fmt::v7::
  make_args_checked<std::__cxx11::string,unsigned_int,std::__cxx11::string,unsigned_int,char[65],char>
            (&local_178,(v7 *)"assignment width doesn\'t match. left ({0}): {1} right ({2}): {3}",
             (char (*) [65])local_110,local_118,local_120,
             (remove_reference_t<std::__cxx11::basic_string<char>_> *)aVar9.values_,
             (remove_reference_t<unsigned_int> *)in_stack_fffffffffffffba8);
  local_130 = &local_178;
  join_0x00000010_0x00000000_ = fmt::v7::to_string_view<char,_0>(local_108);
  local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_58 = local_130;
  local_48 = local_130;
  local_38 = local_130;
  local_40 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0x2d2d,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)local_130);
  format_str.size_ = (size_t)this_local;
  format_str.data_ = local_180;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = aVar9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = local_190._0_8_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_218,(detail *)local_190._8_8_,format_str,args_00);
  local_2a8 = old_value.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  local_2b8 = stmt;
  local_2b0 = this_00;
  local_2a0 = Var::width_param(this_00);
  local_298 = Var::width_param((Var *)old_value.
                                      super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
  local_290 = &local_2b8;
  local_288 = 5;
  std::allocator<kratos::IRNode_*>::allocator(&local_2b9);
  __l_00._M_len = local_288;
  __l_00._M_array = (iterator)local_290;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            (&local_280,__l_00,&local_2b9);
  StmtException::StmtException(pSVar8,&local_218,&local_280);
  local_2ba = 0;
  __cxa_throw(pSVar8,&StmtException::typeinfo,StmtException::~StmtException);
}

Assistant:

void visit(AssignStmt* stmt) override {
        auto* const left = stmt->left();
        auto* right = stmt->right();
        // if the right hand side is a const and it's safe to do so, we will let it happen
        if (left->width() != right->width()) {
            if (right->type() == VarType::ConstValue) {
                auto old_value = right->as<Const>();
                try {
                    auto& new_const =
                        constant(old_value->value(), left->width(), old_value->is_signed());
                    stmt->set_right(new_const.shared_from_this());
                    right = &new_const;
                } catch (::runtime_error&) {
                    std::cerr << "Failed to convert constants. Expect an exception" << std::endl;
                }
            }
        }
        if (left->width() != right->width())
            throw StmtException(
                ::format("assignment width doesn't match. left ({0}): {1} right ({2}): {3}",
                         left->to_string(), left->width(), right->to_string(), right->width()),
                {stmt, left, right, left->width_param(), right->width_param()});
        if (left->is_signed() != right->is_signed())
            throw StmtException(
                ::format("assignment sign doesn't match. left ({0}): {1} right ({2}): {3}",
                         left->to_string(), left->is_signed(), right->to_string(),
                         right->is_signed()),
                {stmt, left, right, left->width_param(), right->width_param()});
        check_expr(right, stmt);
    }